

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase395::run(TestCase395 *this)

{
  bool bVar1;
  uint uVar2;
  MonotonicClock *pMVar3;
  Fault local_148;
  Fault f;
  Quantity<long,_kj::_::NanosecondLabel> local_130;
  bool local_121;
  undefined8 uStack_120;
  bool _kj_shouldLog_1;
  Quantity<long,_kj::_::NanosecondLabel> local_118;
  Quantity<long,_kj::_::NanosecondLabel> *local_110;
  undefined1 local_108 [8];
  DebugComparison<kj::Quantity<long,_kj::_::NanosecondLabel>_&,_kj::Quantity<long,_kj::_::NanosecondLabel>_>
  _kjCondition_1;
  Quantity<long,_kj::_::NanosecondLabel> local_d8;
  Quantity<long,_kj::_::NanosecondLabel> t;
  bool _kj_shouldLog;
  DebugExpression<unsigned_int_&> DStack_c8;
  undefined1 local_c0 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  Quantity<long,_kj::_::NanosecondLabel> local_88;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> local_80;
  undefined1 local_69;
  undefined1 *local_68;
  uint local_60 [2];
  uint m;
  Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> local_50;
  TimePoint start;
  undefined1 local_40 [8];
  MutexGuarded<unsigned_int> value;
  uint retryCount;
  MonotonicClock *clock;
  TestCase395 *this_local;
  
  pMVar3 = systemPreciseMonotonicClock();
  value._28_4_ = 0;
  while( true ) {
    if (0x13 < (uint)value._28_4_) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                (&local_148,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x1a7,FAILED,(char *)0x0,"\"time not within expected bounds even after retries\"",
                 (char (*) [51])"time not within expected bounds even after retries");
      kj::_::Debug::Fault::fatal(&local_148);
    }
    start.value.value._4_4_ = 0x7b;
    MutexGuarded<unsigned_int>::MutexGuarded<int>
              ((MutexGuarded<unsigned_int> *)local_40,(int *)((long)&start.value.value + 4));
    local_50.value.value =
         (Quantity<long,_kj::_::NanosecondLabel>)(*(code *)**(undefined8 **)pMVar3)();
    local_68 = local_40;
    local_88 = operator*<int,_long,_kj::_::NanosecondLabel,_void>
                         (100,(Quantity<long,_kj::_::NanosecondLabel>)0xf4240);
    Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::Maybe(&local_80,&local_88);
    uVar2 = MutexGuarded<unsigned_int>::
            when<kj::(anonymous_namespace)::TestCase395::run()::__0,kj::(anonymous_namespace)::TestCase395::run()::__1>
                      ((MutexGuarded<unsigned_int> *)local_40,&local_68,&local_69);
    Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::~Maybe(&local_80);
    local_60[0] = uVar2;
    DStack_c8 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,local_60);
    t.value._4_4_ = 0x1c8;
    kj::_::DebugExpression<unsigned_int&>::operator==
              ((DebugComparison<unsigned_int_&,_int> *)local_c0,
               (DebugExpression<unsigned_int&> *)&stack0xffffffffffffff38,
               (int *)((long)&t.value + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c0);
    if (!bVar1) {
      t.value._3_1_ = kj::_::Debug::shouldLog(ERROR);
      while ((bool)t.value._3_1_ != false) {
        kj::_::Debug::log<char_const(&)[26],kj::_::DebugComparison<unsigned_int&,int>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                   ,0x19d,ERROR,"\"failed: expected \" \"m == 456\", _kjCondition",
                   (char (*) [26])"failed: expected m == 456",
                   (DebugComparison<unsigned_int_&,_int> *)local_c0);
        t.value._3_1_ = false;
      }
    }
    _kjCondition_1._32_8_ = (*(code *)**(undefined8 **)pMVar3)();
    local_d8 = Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>::operator-
                         ((Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> *)
                          &_kjCondition_1.result,&local_50);
    local_110 = (Quantity<long,_kj::_::NanosecondLabel> *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_d8);
    uStack_120 = 1000000;
    local_118 = operator*<int,_long,_kj::_::NanosecondLabel,_void>
                          (100,(Quantity<long,_kj::_::NanosecondLabel>)0xf4240);
    kj::_::DebugExpression<kj::Quantity<long,kj::_::NanosecondLabel>&>::operator>=
              ((DebugComparison<kj::Quantity<long,_kj::_::NanosecondLabel>_&,_kj::Quantity<long,_kj::_::NanosecondLabel>_>
                *)local_108,
               (DebugExpression<kj::Quantity<long,kj::_::NanosecondLabel>&> *)&local_110,&local_118)
    ;
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_108);
    if (!bVar1) {
      local_121 = kj::_::Debug::shouldLog(ERROR);
      while (local_121 != false) {
        kj::_::Debug::
        log<char_const(&)[45],kj::_::DebugComparison<kj::Quantity<long,kj::_::NanosecondLabel>&,kj::Quantity<long,kj::_::NanosecondLabel>>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                   ,0x1a0,ERROR,
                   "\"failed: expected \" \"t >= 100 * kj::MILLISECONDS\", _kjCondition",
                   (char (*) [45])"failed: expected t >= 100 * kj::MILLISECONDS",
                   (DebugComparison<kj::Quantity<long,_kj::_::NanosecondLabel>_&,_kj::Quantity<long,_kj::_::NanosecondLabel>_>
                    *)local_108);
        local_121 = false;
      }
    }
    local_130 = operator*<int,_long,_kj::_::NanosecondLabel,_void>
                          (0x78,(Quantity<long,_kj::_::NanosecondLabel>)0xf4240);
    f.exception._4_1_ =
         Quantity<long,kj::_::NanosecondLabel>::operator<=
                   ((Quantity<long,kj::_::NanosecondLabel> *)&local_d8,&local_130);
    f.exception._5_3_ = 0;
    MutexGuarded<unsigned_int>::~MutexGuarded((MutexGuarded<unsigned_int> *)local_40);
    if (f.exception._4_4_ != 0) break;
    value._28_4_ = value._28_4_ + 1;
  }
  return;
}

Assistant:

TEST(Mutex, WhenWithTimeoutPreciseTiming) {
  // Test that MutexGuarded::when() with a timeout sleeps for precisely the right amount of time.

  auto& clock = systemPreciseMonotonicClock();

  for (uint retryCount = 0; retryCount < 20; retryCount++) {
    MutexGuarded<uint> value(123);

    auto start = clock.now();
    uint m = value.when([&value](uint n) {
      // HACK: Reset the value as a way of testing what happens when the waiting thread is woken
      //   up but then finds it's not ready yet.
      value.getWithoutLock() = 123;
      return n == 321;
    }, [](uint& n) {
      return 456;
    }, 100 * kj::MILLISECONDS);

    KJ_EXPECT(m == 456);

    auto t = clock.now() - start;
    KJ_EXPECT(t >= 100 * kj::MILLISECONDS);
    // Provide a large margin of error here because some operating systems (e.g. Windows) can have
    // long timeslices (13ms) and won't schedule more precisely than a timeslice.
    if (t <= 120 * kj::MILLISECONDS) {
      return;
    }
  }
  KJ_FAIL_ASSERT("time not within expected bounds even after retries");
}